

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall DLevelScript::GetPlayerInput(DLevelScript *this,int playernum,int inputnum)

{
  int iVar1;
  AActor *pAVar2;
  player_t *p;
  
  if (playernum < 0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
    if (pAVar2 != (AActor *)0x0) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
      p = pAVar2->player;
      if (p != (player_t *)0x0) goto LAB_004853ae;
    }
  }
  else if (((uint)playernum < 8) && (playeringame[(uint)playernum] == true)) {
    p = (player_t *)(&players + (ulong)(uint)playernum * 0x54);
LAB_004853ae:
    iVar1 = P_Thing_CheckInputNum(p,inputnum);
    return iVar1;
  }
  return 0;
}

Assistant:

int DLevelScript::GetPlayerInput(int playernum, int inputnum)
{
	player_t *p;

	if (playernum < 0)
	{
		if (activator == NULL)
		{
			return 0;
		}
		p = activator->player;
	}
	else if (playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return 0;
	}
	else
	{
		p = &players[playernum];
	}
	if (p == NULL)
	{
		return 0;
	}

	return P_Thing_CheckInputNum(p, inputnum);
}